

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

_Bool sysbvm_orderedCollection_identityIncludes
                (sysbvm_tuple_t orderedCollection,sysbvm_tuple_t element)

{
  _Bool _Var1;
  sysbvm_size_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t local_38;
  size_t i;
  size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  sysbvm_tuple_t element_local;
  sysbvm_tuple_t orderedCollection_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (_Var1) {
    sVar2 = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
    for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
      sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(orderedCollection + 0x18),local_38);
      if (sVar3 == element) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_orderedCollection_identityIncludes(sysbvm_tuple_t orderedCollection, sysbvm_tuple_t element)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection)) return false;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    size_t size = sysbvm_tuple_size_decode(orderedCollectionObject->size);
    for(size_t i = 0; i < size; ++i)
    {
        if(sysbvm_array_at(orderedCollectionObject->storage, i) == element)
            return true;
    }

    return false;
}